

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackGenerator::InstallCMakeProject
          (cmCPackGenerator *this,bool setDestDir,string *installDirectory,
          string *baseTempInstallDirectory,mode_t *default_dir_mode,string *component,
          bool componentInstall,string *installSubDirectory,string *buildConfig,
          string *absoluteDestFiles)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  cmCPackLog *pcVar5;
  long lVar6;
  pointer *msg;
  pointer pbVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ostream *poVar12;
  size_t sVar13;
  char *pcVar14;
  undefined8 *puVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  ulong uVar17;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var18;
  mapped_type *pmVar19;
  long *plVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong *puVar22;
  uint uVar23;
  undefined8 uVar24;
  _Alloc_hider _Var25;
  pointer puVar26;
  pointer pbVar27;
  string dir;
  string tempInstallDirectory;
  ostringstream cmCPackLog_msg_1;
  string localFileName;
  string installFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesBefore;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesAfter;
  string findExpr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  string local_1488;
  undefined1 local_1468 [48];
  bool local_1438;
  bool local_1417;
  string *local_1410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1408;
  undefined1 local_13e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13d8 [4];
  bool local_1397;
  ios_base local_1378 [272];
  value_type local_1268;
  pointer *local_1248;
  long local_1240;
  pointer local_1238 [2];
  string local_1228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11f0;
  string local_11d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *local_11b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11b0;
  _Any_data local_1198;
  code *local_1188;
  code *local_1180;
  undefined1 local_1178 [112];
  ios_base local_1108 [1912];
  cmake local_990;
  cmGlobalGenerator local_638;
  
  local_1408._M_dataplus._M_p = (pointer)&local_1408.field_2;
  pcVar4 = (baseTempInstallDirectory->_M_dataplus)._M_p;
  local_1410 = component;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1408,pcVar4,pcVar4 + baseTempInstallDirectory->_M_string_length);
  local_1228._M_dataplus._M_p = (pointer)&local_1228.field_2;
  pcVar4 = (installDirectory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1228,pcVar4,pcVar4 + installDirectory->_M_string_length);
  std::__cxx11::string::append((char *)&local_1228);
  if (componentInstall) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1178);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1178,"-   Install component: ",0x17);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1178,(local_1410->_M_dataplus)._M_p,
                         local_1410->_M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    pp_Var3 = local_638._vptr_cmGlobalGenerator;
    sVar13 = strlen((char *)local_638._vptr_cmGlobalGenerator);
    cmCPackLog::Log(pcVar5,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2ac,(char *)pp_Var3,sVar13);
    if ((string *)local_638._vptr_cmGlobalGenerator != &local_638.MakeSilentFlag) {
      operator_delete(local_638._vptr_cmGlobalGenerator,
                      (ulong)(local_638.MakeSilentFlag._M_dataplus._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1178);
    std::ios_base::~ios_base(local_1108);
  }
  cmake::cmake(&local_990,RoleScript,CPack);
  pp_Var3 = (_func_int **)(local_1178 + 0x10);
  local_1178._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"");
  cmake::SetHomeDirectory(&local_990,(string *)local_1178);
  if ((_func_int **)local_1178._0_8_ != pp_Var3) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"");
  cmake::SetHomeOutputDirectory(&local_990,(string *)local_1178);
  if ((_func_int **)local_1178._0_8_ != pp_Var3) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._16_8_ = local_990.CurrentSnapshot.Position.Position;
  local_1178._0_8_ = local_990.CurrentSnapshot.State;
  local_1178._8_8_ = local_990.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1178);
  cmake::AddCMakePaths(&local_990);
  local_1198._8_8_ = 0;
  local_1180 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx:692:26)>
               ::_M_invoke;
  local_1188 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx:692:26)>
               ::_M_manager;
  local_1198._M_unused._M_object = this;
  cmake::SetProgressCallback(&local_990,(ProgressCallbackType *)&local_1198);
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,__destroy_functor);
  }
  local_990.Trace = this->Trace;
  local_990.TraceExpand = this->TraceExpand;
  cmGlobalGenerator::cmGlobalGenerator(&local_638,&local_990);
  local_13d8[0]._M_allocated_capacity = local_990.CurrentSnapshot.Position.Position;
  local_13e8._0_8_ = local_990.CurrentSnapshot.State;
  local_13e8._8_8_ = local_990.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_1178,&local_638,(cmStateSnapshot *)local_13e8);
  if (((installSubDirectory->_M_string_length != 0) &&
      (iVar11 = std::__cxx11::string::compare((char *)installSubDirectory), iVar11 != 0)) &&
     (iVar11 = std::__cxx11::string::compare((char *)installSubDirectory), iVar11 != 0)) {
    std::__cxx11::string::_M_append
              ((char *)&local_1408,(ulong)(installSubDirectory->_M_dataplus)._M_p);
  }
  if (componentInstall) {
    std::__cxx11::string::append((char *)&local_1408);
    (*this->_vptr_cmCPackGenerator[7])(local_13e8,this,local_1410);
    std::__cxx11::string::_M_append((char *)&local_1408,local_13e8._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY","");
    pcVar14 = GetOption(this,(string *)local_13e8);
    bVar9 = cmSystemTools::IsOn(pcVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    if (bVar9) {
      std::__cxx11::string::append((char *)&local_1408);
      local_13e8._0_8_ = local_13d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_13e8,"CPACK_PACKAGE_FILE_NAME","");
      GetOption(this,(string *)local_13e8);
      std::__cxx11::string::append((char *)&local_1408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13e8._0_8_ != local_13d8) {
        operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
      }
    }
  }
  local_13e8._0_8_ = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e8,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
  pcVar14 = GetOption(this,(string *)local_13e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._0_8_ != local_13d8) {
    operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
  }
  if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_13e8,pcVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
  }
  if (setDestDir) {
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"CPACK_SET_DESTDIR","");
    pcVar14 = GetOption(this,(string *)local_13e8);
    bVar9 = cmSystemTools::IsInternallyOn(pcVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    if (bVar9) {
      local_13e8._0_8_ = local_13d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_13e8,"CPACK_INSTALL_PREFIX","");
      local_1468._0_8_ = local_1468 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"CPACK_PACKAGING_INSTALL_PREFIX","");
      pcVar14 = GetOption(this,(string *)local_1468);
      SetOption(this,(string *)local_13e8,pcVar14);
      if ((undefined1 *)local_1468._0_8_ != local_1468 + 0x10) {
        operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13e8._0_8_ != local_13d8) {
        operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
      }
    }
    puVar1 = (ulong *)(local_1468 + 0x10);
    local_1468._8_8_ = 0;
    local_1468._16_8_ = local_1468._16_8_ & 0xffffffffffffff00;
    local_13e8._0_8_ = local_13d8;
    local_1468._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"CPACK_INSTALL_PREFIX","");
    pcVar14 = GetOption(this,(string *)local_13e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    if (pcVar14 != (char *)0x0) {
      local_13e8._0_8_ = local_13d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_13e8,"CPACK_INSTALL_PREFIX","");
      GetOption(this,(string *)local_13e8);
      std::__cxx11::string::append(local_1468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13e8._0_8_ != local_13d8) {
        operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
      }
    }
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"CMAKE_INSTALL_PREFIX","");
    cmMakefile::AddDefinition
              ((cmMakefile *)local_1178,(string *)local_13e8,(char *)local_1468._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_13e8,"- Using DESTDIR + CPACK_INSTALL_PREFIX... (mf.AddDefinition)",
               0x3c);
    std::ios::widen((char)(ostream *)local_13e8 + (char)*(undefined8 *)(local_13e8._0_8_ + -0x18));
    std::ostream::put((char)local_13e8);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var25._M_p = local_1488._M_dataplus._M_p;
    sVar13 = strlen(local_1488._M_dataplus._M_p);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2f2,_Var25._M_p,sVar13);
    paVar2 = &local_1488.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1488._M_dataplus._M_p != paVar2) {
      operator_delete(local_1488._M_dataplus._M_p,local_1488.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
    std::ios_base::~ios_base(local_1378);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_13e8,"- Setting CMAKE_INSTALL_PREFIX to \'",0x23);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_13e8,(char *)local_1468._0_8_,local_1468._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var25._M_p = local_1488._M_dataplus._M_p;
    sVar13 = strlen(local_1488._M_dataplus._M_p);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2f5,_Var25._M_p,sVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1488._M_dataplus._M_p != paVar2) {
      operator_delete(local_1488._M_dataplus._M_p,local_1488.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
    std::ios_base::~ios_base(local_1378);
    bVar9 = cmsys::SystemTools::StringStartsWith((char *)local_1468._0_8_,"/");
    if (bVar9) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8
                     ,&local_1408,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1468
                    );
      std::__cxx11::string::operator=((string *)local_1468,(string *)local_13e8);
      uVar24 = local_13d8[0]._M_allocated_capacity;
      _Var25._M_p = (pointer)local_13e8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13e8._0_8_ != local_13d8) {
LAB_0014d531:
        operator_delete(_Var25._M_p,uVar24 + 1);
      }
    }
    else {
      local_1488._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1488,local_1408._M_dataplus._M_p,
                 local_1408._M_dataplus._M_p + local_1408._M_string_length);
      std::__cxx11::string::append((char *)&local_1488);
      plVar20 = (long *)std::__cxx11::string::_M_append((char *)&local_1488,local_1468._0_8_);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar20 == paVar21) {
        local_13d8[0]._0_8_ = paVar21->_M_allocated_capacity;
        local_13d8[0]._8_8_ = plVar20[3];
        local_13e8._0_8_ = local_13d8;
      }
      else {
        local_13d8[0]._0_8_ = paVar21->_M_allocated_capacity;
        local_13e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar20;
      }
      local_13e8._8_8_ = plVar20[1];
      *plVar20 = (long)paVar21;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_1468,(string *)local_13e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13e8._0_8_ != local_13d8) {
        operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
      }
      uVar24 = local_1488.field_2._M_allocated_capacity;
      _Var25._M_p = local_1488._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1488._M_dataplus._M_p != paVar2) goto LAB_0014d531;
    }
    local_1488._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1488,"DESTDIR=","");
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_1488,(ulong)local_1408._M_dataplus._M_p);
    local_13e8._0_8_ = local_13d8;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 == paVar21) {
      local_13d8[0]._0_8_ = paVar21->_M_allocated_capacity;
      local_13d8[0]._8_8_ = puVar15[3];
    }
    else {
      local_13d8[0]._0_8_ = paVar21->_M_allocated_capacity;
      local_13e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar15;
    }
    local_13e8._8_8_ = puVar15[1];
    *puVar15 = paVar21;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    cmsys::SystemTools::PutEnv((string *)local_13e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1488._M_dataplus._M_p != paVar2) {
      operator_delete(local_1488._M_dataplus._M_p,local_1488.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_13e8,"- Creating directory: \'",0x17);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_13e8,(char *)local_1468._0_8_,local_1468._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var25._M_p = local_1488._M_dataplus._M_p;
    sVar13 = strlen(local_1488._M_dataplus._M_p);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x30c,_Var25._M_p,sVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1488._M_dataplus._M_p != paVar2) {
      operator_delete(local_1488._M_dataplus._M_p,local_1488.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
    std::ios_base::~ios_base(local_1378);
    bVar9 = cmsys::SystemTools::MakeDirectory((string *)local_1468,default_dir_mode);
    if (!bVar9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_13e8,"Problem creating temporary directory: ",0x26);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_13e8,(char *)local_1468._0_8_,local_1468._8_8_);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar5 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var25._M_p = local_1488._M_dataplus._M_p;
      sVar13 = strlen(local_1488._M_dataplus._M_p);
      cmCPackLog::Log(pcVar5,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x311,_Var25._M_p,sVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1488._M_dataplus._M_p != paVar2) {
        operator_delete(local_1488._M_dataplus._M_p,local_1488.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
      std::ios_base::~ios_base(local_1378);
      if ((ulong *)local_1468._0_8_ != puVar1) {
        operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
      }
      uVar23 = 0;
      goto LAB_0014e6e1;
    }
    if ((ulong *)local_1468._0_8_ != puVar1) {
      operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
    }
  }
  else {
    (*this->_vptr_cmCPackGenerator[0xb])(this);
    std::__cxx11::string::append((char *)&local_1408);
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"CMAKE_INSTALL_PREFIX","");
    cmMakefile::AddDefinition
              ((cmMakefile *)local_1178,(string *)local_13e8,local_1408._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    bVar9 = cmsys::SystemTools::MakeDirectory(&local_1408,default_dir_mode);
    if (!bVar9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_13e8,"Problem creating temporary directory: ",0x26);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_13e8,local_1408._M_dataplus._M_p,
                           local_1408._M_string_length);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar5 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar24 = local_1468._0_8_;
      sVar13 = strlen((char *)local_1468._0_8_);
      cmCPackLog::Log(pcVar5,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x31b,(char *)uVar24,sVar13);
      if ((undefined1 *)local_1468._0_8_ != local_1468 + 0x10) {
        operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
      std::ios_base::~ios_base(local_1378);
      uVar23 = 0;
      goto LAB_0014e6e1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_13e8,"- Using non-DESTDIR install... (mf.AddDefinition)",0x31);
    std::ios::widen((char)(ostream *)local_13e8 + (char)*(size_type *)(local_13e8._0_8_ + -0x18));
    std::ostream::put((char)local_13e8);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar24 = local_1468._0_8_;
    sVar13 = strlen((char *)local_1468._0_8_);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x321,(char *)uVar24,sVar13);
    if ((undefined1 *)local_1468._0_8_ != local_1468 + 0x10) {
      operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
    std::ios_base::~ios_base(local_1378);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_13e8,"- Setting CMAKE_INSTALL_PREFIX to \'",0x23);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_13e8,local_1408._M_dataplus._M_p,
                         local_1408._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar24 = local_1468._0_8_;
    sVar13 = strlen((char *)local_1468._0_8_);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x324,(char *)uVar24,sVar13);
    if ((undefined1 *)local_1468._0_8_ != local_1468 + 0x10) {
      operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
    std::ios_base::~ios_base(local_1378);
  }
  if (buildConfig->_M_string_length != 0) {
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"BUILD_TYPE","");
    cmMakefile::AddDefinition
              ((cmMakefile *)local_1178,(string *)local_13e8,(buildConfig->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::LowerCase(&local_1488,local_1410);
  iVar11 = std::__cxx11::string::compare((char *)&local_1488);
  if (iVar11 != 0) {
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CMAKE_INSTALL_COMPONENT","");
    cmMakefile::AddDefinition
              ((cmMakefile *)local_1178,(string *)local_13e8,(local_1410->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
  }
  local_13e8._0_8_ = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"CPACK_STRIP_FILES","");
  pcVar14 = GetOption(this,(string *)local_13e8);
  bVar9 = cmSystemTools::IsOff(pcVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._0_8_ != local_13d8) {
    operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CMAKE_INSTALL_DO_STRIP","");
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_13e8,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
  }
  local_1208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_11d8._M_dataplus._M_p = (pointer)&local_11d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_11d8,local_1408._M_dataplus._M_p,
             local_1408._M_dataplus._M_p + local_1408._M_string_length);
  if (componentInstall) {
    cmsys::Glob::Glob((Glob *)local_13e8);
    std::__cxx11::string::append((char *)&local_11d8);
    local_13e8[8] = 1;
    local_1397 = true;
    cmsys::Glob::FindFiles((Glob *)local_13e8,&local_11d8,(GlobMessages *)0x0);
    pvVar16 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_13e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_1208,pvVar16);
    pbVar7 = local_1208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar27 = local_1208.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1208.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1208.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar17 = (long)local_1208.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1208.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar6 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_1208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_1208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar27,pbVar7);
    }
    cmsys::Glob::~Glob((Glob *)local_13e8);
  }
  local_13e8._0_8_ = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e8,"CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION","");
  pcVar14 = GetOption(this,(string *)local_13e8);
  bVar9 = cmSystemTools::IsOn(pcVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._0_8_ != local_13d8) {
    operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
  }
  if (bVar9) {
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION","");
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_13e8,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
  }
  iVar11 = (*this->_vptr_cmCPackGenerator[0x17])(this);
  if ((char)iVar11 == '\0') {
LAB_0014db57:
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION","");
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_13e8,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
  }
  else {
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION","");
    pcVar14 = GetOption(this,(string *)local_13e8);
    bVar9 = cmSystemTools::IsOn(pcVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    if (bVar9) goto LAB_0014db57;
  }
  bVar9 = cmMakefile::ReadListFile((cmMakefile *)local_1178,&local_1228);
  local_13e8._0_8_ = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e8,"CMAKE_ABSOLUTE_DESTINATION_FILES","");
  pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_13e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._0_8_ != local_13d8) {
    operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
  }
  if (pcVar14 != (char *)0x0) {
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CPACK_ABSOLUTE_DESTINATION_FILES","");
    local_1468._0_8_ = local_1468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1468,"CMAKE_ABSOLUTE_DESTINATION_FILES","");
    pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1468);
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_13e8,pcVar14);
    if ((undefined1 *)local_1468._0_8_ != local_1468 + 0x10) {
      operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
  }
  if (componentInstall) {
    cmsys::Glob::Glob((Glob *)local_1468);
    local_1468[8] = 1;
    local_1417 = true;
    local_1438 = false;
    cmsys::Glob::FindFiles((Glob *)local_1468,&local_11d8,(GlobMessages *)0x0);
    pvVar16 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_1468);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_11f0,pvVar16);
    uVar8 = local_11f0._8_8_;
    uVar24 = local_11f0._M_allocated_capacity;
    if (local_11f0._M_allocated_capacity != local_11f0._8_8_) {
      uVar17 = (long)(local_11f0._8_8_ - local_11f0._0_8_) >> 5;
      lVar6 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_11f0._M_allocated_capacity,local_11f0._8_8_,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (uVar24,uVar8);
      uVar24 = local_11f0._8_8_;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_11b0,(long)(uVar24 - local_11f0._0_8_) >> 5,(allocator_type *)local_13e8);
    _Var18 = std::
             __set_difference<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                       (local_11f0._M_allocated_capacity,local_11f0._8_8_,
                        local_1208.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        local_1208.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_11b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    local_1268._M_dataplus._M_p = (pointer)&local_1268.field_2;
    local_1268._M_string_length = 0;
    local_1268.field_2._M_local_buf[0] = '\0';
    if (local_11b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != _Var18._M_current) {
      local_11b8 = &this->Components;
      pbVar27 = local_11b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmSystemTools::RelativePath((string *)local_13e8,&local_1408,pbVar27);
        std::__cxx11::string::operator=((string *)&local_1268,(string *)local_13e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_13e8._0_8_ != local_13d8) {
          operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::find_first_not_of((char)&local_1268,0x2f);
        std::__cxx11::string::substr((ulong)local_13e8,(ulong)&local_1268);
        std::__cxx11::string::operator=((string *)&local_1268,(string *)local_13e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_13e8._0_8_ != local_13d8) {
          operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
        }
        pmVar19 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                  ::operator[](local_11b8,local_1410);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar19->Files,&local_1268);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_13e8,"Adding file <",0xd);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_13e8,local_1268._M_dataplus._M_p,
                             local_1268._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"> to component <",0x10);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(local_1410->_M_dataplus)._M_p,local_1410->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,">",1);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar5 = this->Logger;
        std::__cxx11::stringbuf::str();
        msg = local_1248;
        sVar13 = strlen((char *)local_1248);
        cmCPackLog::Log(pcVar5,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x374,(char *)msg,sVar13);
        if (local_1248 != local_1238) {
          operator_delete(local_1248,(long)local_1238[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
        std::ios_base::~ios_base(local_1378);
        pbVar27 = pbVar27 + 1;
      } while (pbVar27 != _Var18._M_current);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
        operator_delete(local_1268._M_dataplus._M_p,
                        CONCAT71(local_1268.field_2._M_allocated_capacity._1_7_,
                                 local_1268.field_2._M_local_buf[0]) + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_11b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_11f0);
    cmsys::Glob::~Glob((Glob *)local_1468);
  }
  local_13e8._0_8_ = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e8,"CPACK_ABSOLUTE_DESTINATION_FILES","");
  pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_13e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._0_8_ != local_13d8) {
    operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
  }
  if (pcVar14 != (char *)0x0) {
    if (absoluteDestFiles->_M_string_length != 0) {
      std::__cxx11::string::append((char *)absoluteDestFiles);
    }
    local_13e8._0_8_ = local_13d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13e8,"CPACK_ABSOLUTE_DESTINATION_FILES","");
    cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_13e8);
    std::__cxx11::string::append((char *)absoluteDestFiles);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._0_8_ != local_13d8) {
      operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_13e8,"Got some ABSOLUTE DESTINATION FILES: ",0x25);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_13e8,(absoluteDestFiles->_M_dataplus)._M_p,
                         absoluteDestFiles->_M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar24 = local_1468._0_8_;
    sVar13 = strlen((char *)local_1468._0_8_);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x37f,(char *)uVar24,sVar13);
    puVar1 = (ulong *)(local_1468 + 0x10);
    if ((ulong *)local_1468._0_8_ != puVar1) {
      operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13e8);
    std::ios_base::~ios_base(local_1378);
    if (componentInstall) {
      paVar2 = &local_1268.field_2;
      local_1268._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1268,"CPACK_ABSOLUTE_DESTINATION_FILES","");
      plVar20 = (long *)std::__cxx11::string::append((char *)&local_1268);
      puVar22 = (ulong *)(plVar20 + 2);
      if ((ulong *)*plVar20 == puVar22) {
        local_1468._16_8_ = *puVar22;
        local_1468._24_4_ = (undefined4)plVar20[3];
        local_1468._28_4_ = *(undefined4 *)((long)plVar20 + 0x1c);
        local_1468._0_8_ = puVar1;
      }
      else {
        local_1468._16_8_ = *puVar22;
        local_1468._0_8_ = (ulong *)*plVar20;
      }
      local_1468._8_8_ = plVar20[1];
      *plVar20 = (long)puVar22;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      (*this->_vptr_cmCPackGenerator[7])(&local_1248,this,local_1410);
      puVar26 = (pointer)0xf;
      if ((ulong *)local_1468._0_8_ != puVar1) {
        puVar26 = (pointer)local_1468._16_8_;
      }
      if (puVar26 < (pointer)(local_1240 + local_1468._8_8_)) {
        puVar26 = (pointer)0xf;
        if (local_1248 != local_1238) {
          puVar26 = local_1238[0];
        }
        if (puVar26 < (pointer)(local_1240 + local_1468._8_8_)) goto LAB_0014e457;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1248,0,(char *)0x0,local_1468._0_8_);
      }
      else {
LAB_0014e457:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_1468,(ulong)local_1248);
      }
      local_13e8._0_8_ = local_13d8;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 == paVar21) {
        local_13d8[0]._0_8_ = paVar21->_M_allocated_capacity;
        local_13d8[0]._8_8_ = puVar15[3];
      }
      else {
        local_13d8[0]._0_8_ = paVar21->_M_allocated_capacity;
        local_13e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar15;
      }
      local_13e8._8_8_ = puVar15[1];
      *puVar15 = paVar21;
      puVar15[1] = 0;
      paVar21->_M_local_buf[0] = '\0';
      if (local_1248 != local_1238) {
        operator_delete(local_1248,(long)local_1238[0] + 1);
      }
      if ((ulong *)local_1468._0_8_ != puVar1) {
        operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1268._M_dataplus._M_p != paVar2) {
        operator_delete(local_1268._M_dataplus._M_p,
                        CONCAT71(local_1268.field_2._M_allocated_capacity._1_7_,
                                 local_1268.field_2._M_local_buf[0]) + 1);
      }
      pcVar14 = GetOption(this,(string *)local_13e8);
      if (pcVar14 == (char *)0x0) {
        local_1468._0_8_ = puVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1468,"CPACK_ABSOLUTE_DESTINATION_FILES","");
        pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1468);
        SetOption(this,(string *)local_13e8,pcVar14);
      }
      else {
        pcVar14 = GetOption(this,(string *)local_13e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1468,pcVar14,(allocator<char> *)&local_1268);
        std::__cxx11::string::append(local_1468);
        local_1268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1268,"CPACK_ABSOLUTE_DESTINATION_FILES","");
        cmMakefile::GetDefinition((cmMakefile *)local_1178,&local_1268);
        std::__cxx11::string::append(local_1468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1268._M_dataplus._M_p != paVar2) {
          operator_delete(local_1268._M_dataplus._M_p,
                          CONCAT71(local_1268.field_2._M_allocated_capacity._1_7_,
                                   local_1268.field_2._M_local_buf[0]) + 1);
        }
        SetOption(this,(string *)local_13e8,(char *)local_1468._0_8_);
      }
      if ((ulong *)local_1468._0_8_ != puVar1) {
        operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13e8._0_8_ != local_13d8) {
        operator_delete((void *)local_13e8._0_8_,local_13d8[0]._M_allocated_capacity + 1);
      }
    }
  }
  bVar10 = true;
  if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)) {
    bVar10 = cmSystemTools::GetInterruptFlag();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11d8._M_dataplus._M_p != &local_11d8.field_2) {
    operator_delete(local_11d8._M_dataplus._M_p,local_11d8.field_2._0_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1488._M_dataplus._M_p != &local_1488.field_2) {
    operator_delete(local_1488._M_dataplus._M_p,local_1488.field_2._M_allocated_capacity + 1);
  }
  uVar23 = (uint)(bVar9 & (bVar10 ^ 1U));
LAB_0014e6e1:
  cmMakefile::~cmMakefile((cmMakefile *)local_1178);
  cmGlobalGenerator::~cmGlobalGenerator(&local_638);
  cmake::~cmake(&local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1228._M_dataplus._M_p != &local_1228.field_2) {
    operator_delete(local_1228._M_dataplus._M_p,local_1228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._M_dataplus._M_p != &local_1408.field_2) {
    operator_delete(local_1408._M_dataplus._M_p,local_1408.field_2._M_allocated_capacity + 1);
  }
  return uVar23;
}

Assistant:

int cmCPackGenerator::InstallCMakeProject(
  bool setDestDir, const std::string& installDirectory,
  const std::string& baseTempInstallDirectory, const mode_t* default_dir_mode,
  const std::string& component, bool componentInstall,
  const std::string& installSubDirectory, const std::string& buildConfig,
  std::string& absoluteDestFiles)
{
  std::string tempInstallDirectory = baseTempInstallDirectory;
  std::string installFile = installDirectory + "/cmake_install.cmake";

  if (componentInstall) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "-   Install component: " << component << std::endl);
  }

  cmake cm(cmake::RoleScript, cmState::CPack);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cm.AddCMakePaths();
  cm.SetProgressCallback([this](const std::string& msg, float prog) {
    this->DisplayVerboseOutput(msg, prog);
  });
  cm.SetTrace(this->Trace);
  cm.SetTraceExpand(this->TraceExpand);
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!installSubDirectory.empty() && installSubDirectory != "/" &&
      installSubDirectory != ".") {
    tempInstallDirectory += installSubDirectory;
  }
  if (componentInstall) {
    tempInstallDirectory += "/";
    // Some CPack generators would rather chose
    // the local installation directory suffix.
    // Some (e.g. RPM) use
    //  one install directory for each component **GROUP**
    // instead of the default
    //  one install directory for each component.
    tempInstallDirectory += GetComponentInstallDirNameSuffix(component);
    if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
      tempInstallDirectory += "/";
      tempInstallDirectory += this->GetOption("CPACK_PACKAGE_FILE_NAME");
    }
  }

  const char* default_dir_inst_permissions =
    this->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_inst_permissions && *default_dir_inst_permissions) {
    mf.AddDefinition("CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
                     default_dir_inst_permissions);
  }

  if (!setDestDir) {
    tempInstallDirectory += this->GetPackagingInstallPrefix();
  }

  if (setDestDir) {
    // For DESTDIR based packaging, use the *project*
    // CMAKE_INSTALL_PREFIX underneath the tempInstallDirectory. The
    // value of the project's CMAKE_INSTALL_PREFIX is sent in here as
    // the value of the CPACK_INSTALL_PREFIX variable.
    //
    // If DESTDIR has been 'internally set ON' this means that
    // the underlying CPack specific generator did ask for that
    // In this case we may override CPACK_INSTALL_PREFIX with
    // CPACK_PACKAGING_INSTALL_PREFIX
    // I know this is tricky and awkward but it's the price for
    // CPACK_SET_DESTDIR backward compatibility.
    if (cmSystemTools::IsInternallyOn(this->GetOption("CPACK_SET_DESTDIR"))) {
      this->SetOption("CPACK_INSTALL_PREFIX",
                      this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX"));
    }
    std::string dir;
    if (this->GetOption("CPACK_INSTALL_PREFIX")) {
      dir += this->GetOption("CPACK_INSTALL_PREFIX");
    }
    mf.AddDefinition("CMAKE_INSTALL_PREFIX", dir.c_str());

    cmCPackLogger(
      cmCPackLog::LOG_DEBUG,
      "- Using DESTDIR + CPACK_INSTALL_PREFIX... (mf.AddDefinition)"
        << std::endl);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'"
                                                        << std::endl);

    // Make sure that DESTDIR + CPACK_INSTALL_PREFIX directory
    // exists:
    //
    if (cmSystemTools::StringStartsWith(dir.c_str(), "/")) {
      dir = tempInstallDirectory + dir;
    } else {
      dir = tempInstallDirectory + "/" + dir;
    }
    /*
     *  We must re-set DESTDIR for each component
     *  We must not add the CPACK_INSTALL_PREFIX part because
     *  it will be added using the override of CMAKE_INSTALL_PREFIX
     *  The main reason for this awkward trick is that
     *  are using DESTDIR for 2 different reasons:
     *     - Because it was asked by the CPack Generator or the user
     *       using CPACK_SET_DESTDIR
     *     - Because it was already used for component install
     *       in order to put things in subdirs...
     */
    cmSystemTools::PutEnv(std::string("DESTDIR=") + tempInstallDirectory);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Creating directory: '" << dir << "'" << std::endl);

    if (!cmsys::SystemTools::MakeDirectory(dir, default_dir_mode)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem creating temporary directory: " << dir
                                                             << std::endl);
      return 0;
    }
  } else {
    mf.AddDefinition("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

    if (!cmsys::SystemTools::MakeDirectory(tempInstallDirectory,
                                           default_dir_mode)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem creating temporary directory: "
                      << tempInstallDirectory << std::endl);
      return 0;
    }

    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Using non-DESTDIR install... (mf.AddDefinition)"
                    << std::endl);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Setting CMAKE_INSTALL_PREFIX to '" << tempInstallDirectory
                                                        << "'" << std::endl);
  }

  if (!buildConfig.empty()) {
    mf.AddDefinition("BUILD_TYPE", buildConfig.c_str());
  }
  std::string installComponentLowerCase = cmSystemTools::LowerCase(component);
  if (installComponentLowerCase != "all") {
    mf.AddDefinition("CMAKE_INSTALL_COMPONENT", component.c_str());
  }

  // strip on TRUE, ON, 1, one or several file names, but not on
  // FALSE, OFF, 0 and an empty string
  if (!cmSystemTools::IsOff(this->GetOption("CPACK_STRIP_FILES"))) {
    mf.AddDefinition("CMAKE_INSTALL_DO_STRIP", "1");
  }
  // Remember the list of files before installation
  // of the current component (if we are in component install)
  std::string const& InstallPrefix = tempInstallDirectory;
  std::vector<std::string> filesBefore;
  std::string findExpr = tempInstallDirectory;
  if (componentInstall) {
    cmsys::Glob glB;
    findExpr += "/*";
    glB.RecurseOn();
    glB.SetRecurseListDirs(true);
    glB.FindFiles(findExpr);
    filesBefore = glB.GetFiles();
    std::sort(filesBefore.begin(), filesBefore.end());
  }

  // If CPack was asked to warn on ABSOLUTE INSTALL DESTINATION
  // then forward request to cmake_install.cmake script
  if (this->IsOn("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")) {
    mf.AddDefinition("CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION", "1");
  }
  // If current CPack generator does support
  // ABSOLUTE INSTALL DESTINATION or CPack has been asked for
  // then ask cmake_install.cmake script to error out
  // as soon as it occurs (before installing file)
  if (!SupportsAbsoluteDestination() ||
      this->IsOn("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")) {
    mf.AddDefinition("CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION", "1");
  }
  // do installation
  bool res = mf.ReadListFile(installFile);
  // forward definition of CMAKE_ABSOLUTE_DESTINATION_FILES
  // to CPack (may be used by generators like CPack RPM or DEB)
  // in order to transparently handle ABSOLUTE PATH
  if (mf.GetDefinition("CMAKE_ABSOLUTE_DESTINATION_FILES")) {
    mf.AddDefinition("CPACK_ABSOLUTE_DESTINATION_FILES",
                     mf.GetDefinition("CMAKE_ABSOLUTE_DESTINATION_FILES"));
  }

  // Now rebuild the list of files after installation
  // of the current component (if we are in component install)
  if (componentInstall) {
    cmsys::Glob glA;
    glA.RecurseOn();
    glA.SetRecurseListDirs(true);
    glA.SetRecurseThroughSymlinks(false);
    glA.FindFiles(findExpr);
    std::vector<std::string> filesAfter = glA.GetFiles();
    std::sort(filesAfter.begin(), filesAfter.end());
    std::vector<std::string>::iterator diff;
    std::vector<std::string> result(filesAfter.size());
    diff = std::set_difference(filesAfter.begin(), filesAfter.end(),
                               filesBefore.begin(), filesBefore.end(),
                               result.begin());

    std::vector<std::string>::iterator fit;
    std::string localFileName;
    // Populate the File field of each component
    for (fit = result.begin(); fit != diff; ++fit) {
      localFileName = cmSystemTools::RelativePath(InstallPrefix, *fit);
      localFileName =
        localFileName.substr(localFileName.find_first_not_of('/'));
      Components[component].Files.push_back(localFileName);
      cmCPackLogger(cmCPackLog::LOG_DEBUG,
                    "Adding file <" << localFileName << "> to component <"
                                    << component << ">" << std::endl);
    }
  }

  if (nullptr != mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES")) {
    if (!absoluteDestFiles.empty()) {
      absoluteDestFiles += ";";
    }
    absoluteDestFiles += mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES");
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Got some ABSOLUTE DESTINATION FILES: " << absoluteDestFiles
                                                          << std::endl);
    // define component specific var
    if (componentInstall) {
      std::string absoluteDestFileComponent =
        std::string("CPACK_ABSOLUTE_DESTINATION_FILES") + "_" +
        GetComponentInstallDirNameSuffix(component);
      if (nullptr != this->GetOption(absoluteDestFileComponent)) {
        std::string absoluteDestFilesListComponent =
          this->GetOption(absoluteDestFileComponent);
        absoluteDestFilesListComponent += ";";
        absoluteDestFilesListComponent +=
          mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES");
        this->SetOption(absoluteDestFileComponent,
                        absoluteDestFilesListComponent.c_str());
      } else {
        this->SetOption(absoluteDestFileComponent,
                        mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES"));
      }
    }
  }
  if (cmSystemTools::GetErrorOccuredFlag() || !res) {
    return 0;
  }
  return 1;
}